

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O0

size_t duckdb_zstd::HUF_compress4X_usingCTable_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable,int flags)

{
  uint uVar1;
  void *pvVar2;
  void *code;
  void *src_00;
  ulong in_RCX;
  ulong in_RSI;
  long in_RDI;
  size_t cSize_3;
  size_t cSize_2;
  size_t cSize_1;
  size_t cSize;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *iend;
  BYTE *ip;
  size_t segmentSize;
  HUF_CElt *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  undefined8 local_8;
  
  if (in_RSI < 0x11) {
    local_8 = (void *)0x0;
  }
  else if (in_RCX < 0xc) {
    local_8 = (void *)0x0;
  }
  else {
    pvVar2 = (void *)(in_RDI + 6);
    code = (void *)HUF_compress1X_usingCTable_internal
                             (pvVar2,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                              (size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
    uVar1 = ERR_isError((size_t)code);
    local_8 = code;
    if (uVar1 == 0) {
      if ((code == (void *)0x0) || ((void *)0xffff < code)) {
        local_8 = (void *)0x0;
      }
      else {
        MEM_writeLE16(in_stack_ffffffffffffff80,(U16)((ulong)in_stack_ffffffffffffff78 >> 0x30));
        pvVar2 = (void *)((long)code + (long)pvVar2);
        src_00 = (void *)HUF_compress1X_usingCTable_internal
                                   (pvVar2,(size_t)code,in_stack_ffffffffffffff88,
                                    (size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
        uVar1 = ERR_isError((size_t)src_00);
        local_8 = src_00;
        if (uVar1 == 0) {
          if ((src_00 == (void *)0x0) || ((void *)0xffff < src_00)) {
            local_8 = (void *)0x0;
          }
          else {
            MEM_writeLE16(in_stack_ffffffffffffff80,(U16)((ulong)in_stack_ffffffffffffff78 >> 0x30))
            ;
            pvVar2 = (void *)((long)src_00 + (long)pvVar2);
            local_8 = (void *)HUF_compress1X_usingCTable_internal
                                        (pvVar2,(size_t)code,src_00,
                                         (size_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                                         ,0);
            uVar1 = ERR_isError((size_t)local_8);
            if (uVar1 == 0) {
              if ((local_8 == (void *)0x0) || ((void *)0xffff < local_8)) {
                local_8 = (void *)0x0;
              }
              else {
                MEM_writeLE16(local_8,(U16)((ulong)in_stack_ffffffffffffff78 >> 0x30));
                pvVar2 = (void *)((long)local_8 + (long)pvVar2);
                local_8 = (void *)HUF_compress1X_usingCTable_internal
                                            (pvVar2,(size_t)code,src_00,(size_t)local_8,
                                             in_stack_ffffffffffffff78,0);
                uVar1 = ERR_isError((size_t)local_8);
                if (uVar1 == 0) {
                  if ((local_8 == (void *)0x0) || ((void *)0xffff < local_8)) {
                    local_8 = (void *)0x0;
                  }
                  else {
                    local_8 = (void *)(((long)local_8 + (long)pvVar2) - in_RDI);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)local_8;
}

Assistant:

static size_t
HUF_compress4X_usingCTable_internal(void* dst, size_t dstSize,
                              const void* src, size_t srcSize,
                              const HUF_CElt* CTable, int flags)
{
    size_t const segmentSize = (srcSize+3)/4;   /* first 3 segments */
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    BYTE* const ostart = (BYTE*) dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    if (dstSize < 6 + 1 + 1 + 1 + 8) return 0;   /* minimum space to compress successfully */
    if (srcSize < 12) return 0;   /* no saving possible : too small input */
    op += 6;   /* jumpTable */

    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart+2, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, segmentSize, CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        MEM_writeLE16(ostart+4, (U16)cSize);
        op += cSize;
    }

    ip += segmentSize;
    assert(op <= oend);
    assert(ip <= iend);
    {   CHECK_V_F(cSize, HUF_compress1X_usingCTable_internal(op, (size_t)(oend-op), ip, (size_t)(iend-ip), CTable, flags) );
        if (cSize == 0 || cSize > 65535) return 0;
        op += cSize;
    }

    return (size_t)(op-ostart);
}